

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void __thiscall log_queue::stop(log_queue *this)

{
  log_entry *this_00;
  size_type sVar1;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->queue_mutex);
  this->active = false;
  while( true ) {
    sVar1 = std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::size
                      ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)
                       this);
    if (sVar1 == 0) break;
    this_00 = *(this->queue).c.
               super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::pop_front
              ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)this);
    if (this_00 != (log_entry *)0x0) {
      log_entry::~log_entry(this_00);
    }
    operator_delete(this_00,0x48);
  }
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void stop() {
            std::unique_lock<std::mutex> lock(queue_mutex);
            active = false;

            while (queue.size() > 0) {
                log_entry* top = queue.front();
                queue.pop();
                delete top;
            }

            wait_for_next_item_condition.notify_all();
        }